

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O2

void Curl_dnscache_prune(Curl_easy *data)

{
  Curl_hash *h;
  time_t tVar1;
  size_t sVar2;
  int iVar3;
  time_t local_48;
  long local_40;
  int local_38;
  
  h = &dnscache_get(data)->entries;
  if (h != (Curl_hash *)0x0) {
    iVar3 = (data->set).dns_cache_timeout;
    dnscache_lock(data,(Curl_dnscache *)h);
    tVar1 = time((time_t *)0x0);
    do {
      local_40 = 0;
      local_48 = tVar1;
      local_38 = iVar3;
      Curl_hash_clean_with_criterium(h,&local_48,dnscache_entry_is_stale);
      iVar3 = (int)local_40;
      if (0x7ffffffe < local_40) {
        iVar3 = 0x7ffffffe;
      }
      if (iVar3 == 0) break;
      sVar2 = Curl_hash_count(h);
    } while (29999 < sVar2);
    dnscache_unlock(data,(Curl_dnscache *)h);
  }
  return;
}

Assistant:

void Curl_dnscache_prune(struct Curl_easy *data)
{
  struct Curl_dnscache *dnscache = dnscache_get(data);
  time_t now;
  /* the timeout may be set -1 (forever) */
  int timeout = data->set.dns_cache_timeout;

  if(!dnscache)
    /* NULL hostcache means we cannot do it */
    return;

  dnscache_lock(data, dnscache);

  now = time(NULL);

  do {
    /* Remove outdated and unused entries from the hostcache */
    time_t oldest = dnscache_prune(&dnscache->entries, timeout, now);

    if(oldest < INT_MAX)
      timeout = (int)oldest; /* we know it fits */
    else
      timeout = INT_MAX - 1;

    /* if the cache size is still too big, use the oldest age as new
       prune limit */
  } while(timeout &&
          (Curl_hash_count(&dnscache->entries) > MAX_DNS_CACHE_SIZE));

  dnscache_unlock(data, dnscache);
}